

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_sign.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte *pbVar1;
  uint uVar2;
  FILE *pFVar3;
  size_t sVar4;
  mbedtls_md_info_t *md_info;
  char *pcVar5;
  char *__format;
  ulong uVar6;
  mbedtls_rsa_context rsa;
  uchar hash [32];
  char filename [512];
  uchar buf [1024];
  
  mbedtls_rsa_init(&rsa,0,0);
  if (argc == 2) {
    printf("\n  . Reading private key from rsa_priv.txt");
    fflush(_stdout);
    pFVar3 = fopen("rsa_priv.txt","rb");
    if (pFVar3 == (FILE *)0x0) {
      pcVar5 = " failed\n  ! Could not open rsa_priv.txt\n  ! Please run rsa_genkey first\n";
      goto LAB_001053c4;
    }
    uVar2 = mbedtls_mpi_read_file(&rsa.N,0x10,(FILE *)pFVar3);
    if (uVar2 != 0) {
LAB_00105398:
      printf(" failed\n  ! mbedtls_mpi_read_file returned %d\n\n",(ulong)uVar2);
      fclose(pFVar3);
      goto LAB_001053ce;
    }
    uVar2 = mbedtls_mpi_read_file(&rsa.E,0x10,(FILE *)pFVar3);
    if (uVar2 != 0) goto LAB_00105398;
    uVar2 = mbedtls_mpi_read_file(&rsa.D,0x10,(FILE *)pFVar3);
    if (uVar2 != 0) goto LAB_00105398;
    uVar2 = mbedtls_mpi_read_file(&rsa.P,0x10,(FILE *)pFVar3);
    if (uVar2 != 0) goto LAB_00105398;
    uVar2 = mbedtls_mpi_read_file(&rsa.Q,0x10,(FILE *)pFVar3);
    if (uVar2 != 0) goto LAB_00105398;
    uVar2 = mbedtls_mpi_read_file(&rsa.DP,0x10,(FILE *)pFVar3);
    if (uVar2 != 0) goto LAB_00105398;
    uVar2 = mbedtls_mpi_read_file(&rsa.DQ,0x10,(FILE *)pFVar3);
    if (uVar2 != 0) goto LAB_00105398;
    uVar2 = mbedtls_mpi_read_file(&rsa.QP,0x10,(FILE *)pFVar3);
    if (uVar2 != 0) goto LAB_00105398;
    sVar4 = mbedtls_mpi_bitlen(&rsa.N);
    rsa.len = sVar4 + 7 >> 3;
    fclose(pFVar3);
    printf("\n  . Checking the private key");
    fflush(_stdout);
    uVar2 = mbedtls_rsa_check_privkey(&rsa);
    if (uVar2 != 0) {
      pcVar5 = " failed\n  ! mbedtls_rsa_check_privkey failed with -0x%0x\n";
LAB_00105439:
      printf(pcVar5,(ulong)-uVar2);
      goto LAB_001053ce;
    }
    printf("\n  . Generating the RSA/SHA-256 signature");
    fflush(_stdout);
    md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
    uVar2 = mbedtls_md_file(md_info,argv[1],hash);
    if (uVar2 != 0) {
      pcVar5 = argv[1];
      __format = " failed\n  ! Could not open or read %s\n\n";
LAB_0010548b:
      printf(__format,pcVar5);
      goto LAB_001053ce;
    }
    uVar2 = mbedtls_rsa_pkcs1_sign
                      (&rsa,(_func_int_void_ptr_uchar_ptr_size_t *)0x0,(void *)0x0,1,
                       MBEDTLS_MD_SHA256,0x14,hash,buf);
    if (uVar2 != 0) {
      pcVar5 = " failed\n  ! mbedtls_rsa_pkcs1_sign returned -0x%0x\n\n";
      goto LAB_00105439;
    }
    snprintf(filename,0x200,"%s.sig",argv[1]);
    pFVar3 = fopen(filename,"wb+");
    if (pFVar3 != (FILE *)0x0) {
      if (rsa.len != 0) {
        uVar6 = 0;
        do {
          pbVar1 = buf + uVar6;
          uVar6 = uVar6 + 1;
          pcVar5 = " ";
          if ((uVar6 & 0xf) == 0) {
            pcVar5 = "\r\n";
          }
          fprintf(pFVar3,"%02X%s",(ulong)*pbVar1,pcVar5);
        } while (uVar6 < rsa.len);
      }
      fclose(pFVar3);
      __format = "\n  . Done (created \"%s\")\n\n";
      uVar2 = 0;
      pcVar5 = filename;
      goto LAB_0010548b;
    }
    printf(" failed\n  ! Could not create %s\n\n",argv[1]);
  }
  else {
    pcVar5 = "usage: rsa_sign <filename>";
LAB_001053c4:
    puts(pcVar5);
  }
  uVar2 = 1;
LAB_001053ce:
  mbedtls_rsa_free(&rsa);
  return uVar2;
}

Assistant:

int main( int argc, char *argv[] )
{
    FILE *f;
    int ret;
    size_t i;
    mbedtls_rsa_context rsa;
    unsigned char hash[32];
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];
    char filename[512];

    mbedtls_rsa_init( &rsa, MBEDTLS_RSA_PKCS_V15, 0 );
    ret = 1;

    if( argc != 2 )
    {
        mbedtls_printf( "usage: rsa_sign <filename>\n" );

#if defined(_WIN32)
        mbedtls_printf( "\n" );
#endif

        goto exit;
    }

    mbedtls_printf( "\n  . Reading private key from rsa_priv.txt" );
    fflush( stdout );

    if( ( f = fopen( "rsa_priv.txt", "rb" ) ) == NULL )
    {
        ret = 1;
        mbedtls_printf( " failed\n  ! Could not open rsa_priv.txt\n" \
                "  ! Please run rsa_genkey first\n\n" );
        goto exit;
    }

    if( ( ret = mbedtls_mpi_read_file( &rsa.N , 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.E , 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.D , 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.P , 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.Q , 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.DP, 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.DQ, 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &rsa.QP, 16, f ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_read_file returned %d\n\n", ret );
        fclose( f );
        goto exit;
    }

    rsa.len = ( mbedtls_mpi_bitlen( &rsa.N ) + 7 ) >> 3;

    fclose( f );

    mbedtls_printf( "\n  . Checking the private key" );
    fflush( stdout );
    if( ( ret = mbedtls_rsa_check_privkey( &rsa ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_rsa_check_privkey failed with -0x%0x\n", -ret );
        goto exit;
    }

    /*
     * Compute the SHA-256 hash of the input file,
     * then calculate the RSA signature of the hash.
     */
    mbedtls_printf( "\n  . Generating the RSA/SHA-256 signature" );
    fflush( stdout );

    if( ( ret = mbedtls_md_file(
                    mbedtls_md_info_from_type( MBEDTLS_MD_SHA256 ),
                    argv[1], hash ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! Could not open or read %s\n\n", argv[1] );
        goto exit;
    }

    if( ( ret = mbedtls_rsa_pkcs1_sign( &rsa, NULL, NULL, MBEDTLS_RSA_PRIVATE, MBEDTLS_MD_SHA256,
                                20, hash, buf ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_rsa_pkcs1_sign returned -0x%0x\n\n", -ret );
        goto exit;
    }

    /*
     * Write the signature into <filename>.sig
     */
    mbedtls_snprintf( filename, sizeof(filename), "%s.sig", argv[1] );

    if( ( f = fopen( filename, "wb+" ) ) == NULL )
    {
        ret = 1;
        mbedtls_printf( " failed\n  ! Could not create %s\n\n", argv[1] );
        goto exit;
    }

    for( i = 0; i < rsa.len; i++ )
        mbedtls_fprintf( f, "%02X%s", buf[i],
                 ( i + 1 ) % 16 == 0 ? "\r\n" : " " );

    fclose( f );

    mbedtls_printf( "\n  . Done (created \"%s\")\n\n", filename );

exit:

    mbedtls_rsa_free( &rsa );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret );
}